

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O3

size_t __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::delete_nodes(table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *this,link_pointer prev,link_pointer end)

{
  size_t sVar1;
  
  if (prev->next_ != end) {
    sVar1 = 0;
    do {
      delete_node(this,prev);
      sVar1 = sVar1 + 1;
    } while (prev->next_ != end);
    return sVar1;
  }
  __assert_fail("prev->next_ != end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/spartanPAGE[P]spartsi/external/boost/unordered/include/boost/unordered/detail/table.hpp"
                ,0x1dc,
                "std::size_t boost::unordered::detail::table<boost::unordered::detail::map<std::allocator<std::pair<const std::basic_string<char>, boost::variant<spartsi::node, spartsi::ref_node>>>, std::basic_string<char>, boost::variant<spartsi::node, spartsi::ref_node>, boost::hash<std::string>, std::equal_to<std::basic_string<char>>>>::delete_nodes(link_pointer, link_pointer) [Types = boost::unordered::detail::map<std::allocator<std::pair<const std::basic_string<char>, boost::variant<spartsi::node, spartsi::ref_node>>>, std::basic_string<char>, boost::variant<spartsi::node, spartsi::ref_node>, boost::hash<std::string>, std::equal_to<std::basic_string<char>>>]"
               );
}

Assistant:

std::size_t delete_nodes(link_pointer prev, link_pointer end)
        {
            BOOST_ASSERT(prev->next_ != end);

            std::size_t count = 0;

            do {
                delete_node(prev);
                ++count;
            } while (prev->next_ != end);

            return count;
        }